

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

void duckdb_snappy::anon_unknown_3::UnalignedCopy128(void *src,void *dst)

{
  undefined8 uVar1;
  char tmp [16];
  void *dst_local;
  void *src_local;
  
  uVar1 = *(undefined8 *)((long)src + 8);
  *(undefined8 *)dst = *src;
  *(undefined8 *)((long)dst + 8) = uVar1;
  return;
}

Assistant:

void UnalignedCopy128(const void* src, void* dst) {
  // std::memcpy() gets vectorized when the appropriate compiler options are
  // used. For example, x86 compilers targeting SSE2+ will optimize to an SSE2
  // load and store.
  char tmp[16];
  std::memcpy(tmp, src, 16);
  std::memcpy(dst, tmp, 16);
}